

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

void ddPatchTree(DdManager *dd,MtrNode *treenode)

{
  MtrNode *auxnode;
  
  if (treenode != (MtrNode *)0x0) {
    do {
      treenode->low = dd->perm[treenode->index];
      if (treenode->child != (MtrNode *)0x0) {
        ddPatchTree(dd,treenode->child);
      }
      treenode = treenode->younger;
    } while (treenode != (MtrNode *)0x0);
  }
  return;
}

Assistant:

static void
ddPatchTree(
  DdManager *dd,
  MtrNode *treenode)
{
    MtrNode *auxnode = treenode;

    while (auxnode != NULL) {
        auxnode->low = dd->perm[auxnode->index];
        if (auxnode->child != NULL) {
            ddPatchTree(dd, auxnode->child);
        }
        auxnode = auxnode->younger;
    }

    return;

}